

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bech32.cpp
# Opt level: O3

bech32_DecodedResult * bech32_create_DecodedResult(char *str)

{
  size_t sVar1;
  size_t sVar2;
  bech32_DecodedResult *__ptr;
  char *__ptr_00;
  uchar *puVar3;
  string inputStr;
  long *local_48;
  ulong local_40;
  long local_38 [2];
  
  if (str == (char *)0x0) {
    return (bech32_DecodedResult *)0x0;
  }
  local_48 = local_38;
  sVar1 = strlen(str);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,str,str + sVar1);
  if (7 < local_40) {
    __ptr = (bech32_DecodedResult *)0x0;
    sVar2 = std::__cxx11::string::find((char)&local_48,0x31);
    if (sVar2 == 0xffffffffffffffff) goto LAB_00118bd2;
    if ((sVar2 - local_40 < 0xfffffffffffffffa) &&
       (__ptr = (bech32_DecodedResult *)malloc(0x28), __ptr != (bech32_DecodedResult *)0x0)) {
      __ptr->hrplen = sVar2;
      __ptr_00 = (char *)calloc(sVar2 + 1,1);
      __ptr->hrp = __ptr_00;
      if (__ptr_00 != (char *)0x0) {
        sVar1 = (local_40 - sVar2) - 7;
        __ptr->dplen = sVar1;
        puVar3 = (uchar *)calloc(sVar1,1);
        __ptr->dp = puVar3;
        if (puVar3 != (uchar *)0x0) {
          __ptr->encoding = ENCODING_INVALID;
          goto LAB_00118bd2;
        }
        free(__ptr_00);
      }
      free(__ptr);
    }
  }
  __ptr = (bech32_DecodedResult *)0x0;
LAB_00118bd2:
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
  return __ptr;
}

Assistant:

bech32_DecodedResult * bech32_create_DecodedResult(const char *str) {
    if(str == nullptr)
        return nullptr;
    // the storage needed for a decoded bech32 string can be easily determined by the
    // length of the input string
    std::string inputStr(str);
    if(inputStr.size() < MIN_BECH32_LENGTH)
        return nullptr;
    size_t index_of_separator = inputStr.find_first_of(bech32::separator);
    if(index_of_separator == std::string::npos)
        return nullptr;
    size_t number_of_hrp_characters = index_of_separator;
    if(inputStr.length() - number_of_hrp_characters - 1 < bech32::limits::CHECKSUM_LENGTH)
        // not enough data characters
        return nullptr;
    size_t number_of_data_characters =
            inputStr.length()
            - number_of_hrp_characters
            - bech32::limits::SEPARATOR_LENGTH
            - bech32::limits::CHECKSUM_LENGTH;

    auto hrpdp = static_cast<bech32_DecodedResult *>(malloc(sizeof (bech32_DecodedResult)));
    if(hrpdp == nullptr)
        return nullptr;
    hrpdp->hrplen = number_of_hrp_characters;
    hrpdp->hrp = static_cast<char *>(calloc(hrpdp->hrplen+1, 1)); // +1 for '\0'
    if(hrpdp->hrp == nullptr) {
        free(hrpdp);
        return nullptr;
    }
    hrpdp->dplen = number_of_data_characters;
    hrpdp->dp = static_cast<unsigned char *>(calloc(hrpdp->dplen, 1));
    if(hrpdp->dp == nullptr) {
        free(hrpdp->hrp);
        free(hrpdp);
        return nullptr;
    }

    hrpdp->encoding = ENCODING_INVALID;

    return hrpdp;
}